

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPLayer.cpp
# Opt level: O1

void __thiscall TCPLayer::notifyWrite(TCPLayer *this)

{
  Buffer *this_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ssize_t sVar4;
  unsigned_long uVar5;
  size_t in_RCX;
  int in_R8D;
  Buffer packet;
  Buffer local_38;
  
  this_00 = &this->outgoingPacket;
  iVar1 = Buffer::getSize(this_00);
  if (0 < iVar1) {
    pcVar3 = Buffer::getData(this_00);
    uVar2 = Buffer::getSize(this_00);
    sVar4 = TCPSocket::send(&this->socket,(int)pcVar3,(void *)(ulong)uVar2,in_RCX,in_R8D);
    Buffer::consume(this_00,(long)(int)sVar4);
    return;
  }
  uVar5 = SynchronizedQueue<Buffer>::getSize(&this->packetsToSend);
  if (uVar5 != 0) {
    SynchronizedQueue<Buffer>::get(&local_38,&this->packetsToSend);
    uVar2 = Buffer::getSize(&local_38);
    Buffer::append(this_00,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                           uVar2 << 0x18);
    pcVar3 = Buffer::getData(&local_38);
    iVar1 = Buffer::getSize(&local_38);
    Buffer::append(this_00,pcVar3,(long)iVar1);
    pcVar3 = Buffer::getData(this_00);
    uVar2 = Buffer::getSize(this_00);
    sVar4 = TCPSocket::send(&this->socket,(int)pcVar3,(void *)(ulong)uVar2,in_RCX,in_R8D);
    Buffer::consume(this_00,(long)(int)sVar4);
    if (local_38.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void TCPLayer::notifyWrite() {
    if(outgoingPacket.getSize() > 0){
        int sentBytes = socket.send(outgoingPacket.getData(), outgoingPacket.getSize());
        outgoingPacket.consume(sentBytes);
    }
    else{
        if(packetsToSend.getSize() > 0){
            auto packet = packetsToSend.get();
            outgoingPacket.append(::htonl(packet.getSize()));
            outgoingPacket.append(packet.getData(), packet.getSize());

            int sentBytes = socket.send(outgoingPacket.getData(), outgoingPacket.getSize());
            outgoingPacket.consume(sentBytes);
        }
    }
}